

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_do_button_text_image
                  (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,char *str,
                  int len,nk_flags align,nk_button_behavior behavior,nk_style_button *style,
                  nk_user_font *font,nk_input *in)

{
  uint state_00;
  undefined4 in_EAX;
  int iVar1;
  nk_bool nVar2;
  nk_style_item *pnVar3;
  nk_color *pnVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  nk_vec2 nVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  nk_rect r;
  undefined8 local_a8;
  nk_text local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  nk_rect content;
  nk_rect bounds_local;
  
  local_68._4_4_ = bounds.y;
  auVar12._0_4_ = -(uint)(out == (nk_command_buffer *)0x0);
  auVar12._4_4_ = -(uint)(font == (nk_user_font *)0x0);
  auVar12._8_4_ = -(uint)(style == (nk_style_button *)0x0);
  auVar12._12_4_ = -(uint)(str == (char *)0x0);
  iVar1 = movmskps(in_EAX,auVar12);
  nVar2 = 0;
  if (iVar1 == 0) {
    local_68._0_4_ = local_68._4_4_;
    fStack_60 = (float)local_68._4_4_;
    fStack_5c = (float)local_68._4_4_;
    local_78._8_4_ = in_XMM1_Dc;
    local_78._0_8_ = bounds._8_8_;
    local_78._12_4_ = in_XMM1_Dd;
    bounds_local = bounds;
    nVar2 = nk_do_button(state,out,bounds,style,in,behavior,&content);
    fVar6 = (style->padding).y;
    fVar9 = (float)local_68._0_4_ + fVar6;
    fVar6 = bounds.h - (fVar6 + fVar6);
    local_a8._0_4_ = bounds.x;
    if ((align & 1) == 0) {
      fVar5 = (style->padding).x;
      fVar5 = fVar5 + fVar5 + (float)local_a8;
    }
    else {
      fVar5 = (style->padding).x;
      fVar10 = ((float)local_a8 + (float)local_78._0_4_) - (fVar5 + fVar5 + fVar6);
      fVar5 = 0.0;
      if (0.0 <= fVar10) {
        fVar5 = fVar10;
      }
    }
    nVar7 = style->image_padding;
    auVar8._8_8_ = 0;
    auVar8._0_4_ = nVar7.x;
    auVar8._4_4_ = nVar7.y;
    fVar10 = nVar7.x + nVar7.x;
    fVar11 = nVar7.y + nVar7.y;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      local_78._4_4_ = fVar11;
      local_78._0_4_ = fVar10;
      local_78._8_8_ = 0;
      _local_68 = auVar8;
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      fVar10 = (float)local_78._0_4_;
      fVar11 = (float)local_78._4_4_;
      nVar7 = (nk_vec2)local_68;
    }
    r.w = fVar6 - fVar10;
    r.h = fVar6 - fVar11;
    state_00 = *state;
    pnVar3 = nk_draw_button(out,&bounds_local,state_00,style);
    pnVar4 = &style->text_background;
    if (pnVar3->type == NK_STYLE_ITEM_COLOR) {
      pnVar4 = (nk_color *)&pnVar3->data;
    }
    local_88.background = *pnVar4;
    if ((state_00 & 0x10) == 0) {
      if ((state_00 & 0x20) == 0) {
        local_88.text = style->text_normal;
      }
      else {
        local_88.text = style->text_active;
      }
    }
    else {
      local_88.text = style->text_hover;
    }
    local_88.padding.x = 0.0;
    local_88.padding.y = 0.0;
    nk_widget_text(out,content,str,len,&local_88,0x12,font);
    r.x = fVar5 + nVar7.x;
    r.y = fVar9 + nVar7.y;
    nk_draw_image(out,r,&img,(nk_color)0xffffffff);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return nVar2;
}

Assistant:

NK_LIB nk_bool
nk_do_button_text_image(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
struct nk_image img, const char* str, int len, nk_flags align,
enum nk_button_behavior behavior, const struct nk_style_button *style,
const struct nk_user_font *font, const struct nk_input *in)
{
int ret;
struct nk_rect icon;
struct nk_rect content;

NK_ASSERT(style);
NK_ASSERT(state);
NK_ASSERT(font);
NK_ASSERT(out);
if (!out || !font || !style || !str)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
icon.y = bounds.y + style->padding.y;
icon.w = icon.h = bounds.h - 2 * style->padding.y;
if (align & NK_TEXT_ALIGN_LEFT) {
icon.x = (bounds.x + bounds.w) - (2 * style->padding.x + icon.w);
icon.x = NK_MAX(icon.x, 0);
} else icon.x = bounds.x + 2 * style->padding.x;

icon.x += style->image_padding.x;
icon.y += style->image_padding.y;
icon.w -= 2 * style->image_padding.x;
icon.h -= 2 * style->image_padding.y;

if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_text_image(out, &bounds, &content, &icon, *state, style, str, len, font, &img);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}